

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

void __thiscall TPZAutoPointer<MD5state_st>::Release(TPZAutoPointer<MD5state_st> *this)

{
  MD5state_st *pMVar1;
  __int_type _Var2;
  TPZReference *in_RDI;
  
  if (((in_RDI->fPointer != (MD5state_st *)0x0) &&
      (_Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_RDI), _Var2 == 0))
     && (pMVar1 = in_RDI->fPointer, pMVar1 != (MD5state_st *)0x0)) {
    TPZReference::~TPZReference(in_RDI);
    operator_delete(pMVar1,0x10);
  }
  in_RDI->fPointer = (MD5state_st *)0x0;
  return;
}

Assistant:

inline void Release(){
        if(fRef && ! fRef->fCounter) {
            delete fRef;
        }
        fRef = nullptr;
    }